

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL FILEInitStdHandles(void)

{
  undefined1 *hObject;
  undefined1 *hObject_00;
  undefined1 *puVar1;
  HANDLE stderr_handle;
  HANDLE stdout_handle;
  HANDLE stdin_handle;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  hObject = (undefined1 *)init_std_handle(&pStdIn,_stdin);
  if (hObject == &DAT_ffffffffffffffff) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  else {
    hObject_00 = (undefined1 *)init_std_handle(&pStdOut,_stdout);
    if (hObject_00 == &DAT_ffffffffffffffff) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      CloseHandle(hObject);
    }
    else {
      puVar1 = (undefined1 *)init_std_handle(&pStdErr,_stderr);
      if (puVar1 != &DAT_ffffffffffffffff) {
        return 1;
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      CloseHandle(hObject);
      CloseHandle(hObject_00);
    }
  }
  pStdIn = &DAT_ffffffffffffffff;
  pStdOut = &DAT_ffffffffffffffff;
  pStdErr = &DAT_ffffffffffffffff;
  return 0;
}

Assistant:

BOOL FILEInitStdHandles(void)
{
    HANDLE stdin_handle;
    HANDLE stdout_handle;
    HANDLE stderr_handle;

    TRACE("creating handle objects for stdin, stdout, stderr\n");

    stdin_handle = init_std_handle(&pStdIn, stdin);
    if(INVALID_HANDLE_VALUE == stdin_handle)
    {
        ERROR("failed to create stdin handle\n");
        goto fail;
    }

    stdout_handle = init_std_handle(&pStdOut, stdout);
    if(INVALID_HANDLE_VALUE == stdout_handle)
    {
        ERROR("failed to create stdout handle\n");
        CloseHandle(stdin_handle);
        goto fail;
    }

    stderr_handle = init_std_handle(&pStdErr, stderr);
    if(INVALID_HANDLE_VALUE == stderr_handle)
    {
        ERROR("failed to create stderr handle\n");
        CloseHandle(stdin_handle);
        CloseHandle(stdout_handle);
        goto fail;
    }
    return TRUE;

fail:
    pStdIn = INVALID_HANDLE_VALUE;
    pStdOut = INVALID_HANDLE_VALUE;
    pStdErr = INVALID_HANDLE_VALUE;
    return FALSE;
}